

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::
     function_signature<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
               (_func_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
                **f)

{
  _func_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
  **f_local;
  
  Function_Signature<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,chaiscript::dispatch::detail::Function_Params<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>,false,false,false,false>
  ::
  Function_Signature<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(*const&)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((Function_Signature<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,chaiscript::dispatch::detail::Function_Params<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>,false,false,false,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }